

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O0

DdNode * extraBddTuples(DdManager *dd,DdNode *bVarsK,DdNode *bVarsN)

{
  DdNode *n;
  DdNode *pDVar1;
  DdHalfWord local_4c;
  DdHalfWord local_44;
  DdNode *local_40;
  DdNode *bRes1;
  DdNode *bRes0;
  DdNode *bRes;
  DdNode *bVarsN_local;
  DdNode *bVarsK_local;
  DdManager *dd_local;
  
  if (bVarsK->index == 0x7fffffff) {
    local_44 = bVarsK->index;
  }
  else {
    local_44 = dd->perm[bVarsK->index];
  }
  if (bVarsN->index == 0x7fffffff) {
    local_4c = bVarsN->index;
  }
  else {
    local_4c = dd->perm[bVarsN->index];
  }
  if ((int)local_44 < (int)local_4c) {
    dd_local = (DdManager *)((ulong)dd->one ^ 1);
  }
  else if (bVarsN == dd->one) {
    dd_local = (DdManager *)dd->one;
  }
  else {
    dd_local = (DdManager *)cuddCacheLookup2(dd,extraBddTuples,bVarsK,bVarsN);
    if (dd_local == (DdManager *)0x0) {
      n = extraBddTuples(dd,bVarsK,(bVarsN->type).kids.T);
      if (n == (DdNode *)0x0) {
        dd_local = (DdManager *)0x0;
      }
      else {
        *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + 1;
        if (bVarsK == dd->one) {
          local_40 = (DdNode *)((ulong)dd->one ^ 1);
          *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) + 1;
        }
        else {
          local_40 = extraBddTuples(dd,(bVarsK->type).kids.T,(bVarsN->type).kids.T);
          if (local_40 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,n);
            return (DdNode *)0x0;
          }
          *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) =
               *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) + 1;
        }
        if (n == local_40) {
          bRes0 = local_40;
        }
        else if (((ulong)local_40 & 1) == 0) {
          bRes0 = cuddUniqueInter(dd,bVarsN->index,local_40,n);
          if (bRes0 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,local_40);
            return (DdNode *)0x0;
          }
        }
        else {
          pDVar1 = cuddUniqueInter(dd,bVarsN->index,(DdNode *)((ulong)local_40 ^ 1),
                                   (DdNode *)((ulong)n ^ 1));
          if (pDVar1 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(dd,n);
            Cudd_RecursiveDeref(dd,local_40);
            return (DdNode *)0x0;
          }
          bRes0 = (DdNode *)((ulong)pDVar1 ^ 1);
        }
        *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)n & 0xfffffffffffffffe) + 4) + -1;
        *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) =
             *(int *)(((ulong)local_40 & 0xfffffffffffffffe) + 4) + -1;
        cuddCacheInsert2(dd,extraBddTuples,bVarsK,bVarsN,bRes0);
        dd_local = (DdManager *)bRes0;
      }
    }
  }
  return &dd_local->sentinel;
}

Assistant:

DdNode * extraBddTuples( 
  DdManager * dd,    /* the DD manager */
  DdNode * bVarsK,   /* the number of variables in tuples */
  DdNode * bVarsN)   /* the set of all variables */
{
    DdNode *bRes, *bRes0, *bRes1;
    statLine(dd); 

    /* terminal cases */
/*  if ( k < 0 || k > n )
 *      return dd->zero;
 *  if ( n == 0 )
 *      return dd->one; 
 */
    if ( cuddI( dd, bVarsK->index ) < cuddI( dd, bVarsN->index ) )
        return b0;
    if ( bVarsN == b1 )
        return b1;

    /* check cache */
    bRes = cuddCacheLookup2(dd, extraBddTuples, bVarsK, bVarsN);
    if (bRes)
        return(bRes);

    /* ZDD in which is variable is 0 */
/*  bRes0 = extraBddTuples( dd, k,     n-1 ); */
    bRes0 = extraBddTuples( dd, bVarsK, cuddT(bVarsN) );
    if ( bRes0 == NULL ) 
        return NULL;
    cuddRef( bRes0 );

    /* ZDD in which is variable is 1 */
/*  bRes1 = extraBddTuples( dd, k-1,          n-1 ); */
    if ( bVarsK == b1 )
    {
        bRes1 = b0;
        cuddRef( bRes1 );
    }
    else
    {
        bRes1 = extraBddTuples( dd, cuddT(bVarsK), cuddT(bVarsN) );
        if ( bRes1 == NULL ) 
        {
            Cudd_RecursiveDeref( dd, bRes0 );
            return NULL;
        }
        cuddRef( bRes1 );
    }

    /* consider the case when Res0 and Res1 are the same node */
    if ( bRes0 == bRes1 )
        bRes = bRes1;
    /* consider the case when Res1 is complemented */
    else if ( Cudd_IsComplement(bRes1) ) 
    {
        bRes = cuddUniqueInter(dd, bVarsN->index, Cudd_Not(bRes1), Cudd_Not(bRes0));
        if ( bRes == NULL ) 
        {
            Cudd_RecursiveDeref(dd,bRes0);
            Cudd_RecursiveDeref(dd,bRes1);
            return NULL;
        }
        bRes = Cudd_Not(bRes);
    } 
    else 
    {
        bRes = cuddUniqueInter( dd, bVarsN->index, bRes1, bRes0 );
        if ( bRes == NULL ) 
        {
            Cudd_RecursiveDeref(dd,bRes0);
            Cudd_RecursiveDeref(dd,bRes1);
            return NULL;
        }
    }
    cuddDeref( bRes0 );
    cuddDeref( bRes1 );

    /* insert the result into cache */
    cuddCacheInsert2(dd, extraBddTuples, bVarsK, bVarsN, bRes);
    return bRes;

}